

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O3

void __thiscall gl3cts::ClipDistance::Utility::Program::~Program(Program *this)

{
  GLuint GVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  GVar1 = (this->m_vertex_shader_status).shader_id;
  if (GVar1 != 0) {
    (*this->m_gl->deleteShader)(GVar1);
    (this->m_vertex_shader_status).shader_id = 0;
  }
  GVar1 = (this->m_fragment_shader_status).shader_id;
  if (GVar1 != 0) {
    (*this->m_gl->deleteShader)(GVar1);
    (this->m_fragment_shader_status).shader_id = 0;
  }
  GVar1 = (this->m_program_status).program_id;
  if (GVar1 != 0) {
    (*this->m_gl->deleteProgram)(GVar1);
    (this->m_program_status).program_id = 0;
  }
  pcVar2 = (this->m_program_status).program_linkage_log._M_dataplus._M_p;
  paVar3 = &(this->m_program_status).program_linkage_log.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_fragment_shader_status).shader_log._M_dataplus._M_p;
  paVar3 = &(this->m_fragment_shader_status).shader_log.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_vertex_shader_status).shader_log._M_dataplus._M_p;
  paVar3 = &(this->m_vertex_shader_status).shader_log.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::~Program()
{
	if (m_vertex_shader_status.shader_id)
	{
		m_gl.deleteShader(m_vertex_shader_status.shader_id);

		m_vertex_shader_status.shader_id = 0;
	}

	if (m_fragment_shader_status.shader_id)
	{
		m_gl.deleteShader(m_fragment_shader_status.shader_id);

		m_fragment_shader_status.shader_id = 0;
	}

	if (m_program_status.program_id)
	{
		m_gl.deleteProgram(m_program_status.program_id);

		m_program_status.program_id = 0;
	}
}